

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::
list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
::~list(list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
        *this)

{
  list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar1;
  list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar2;
  
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  )._vptr_list_elem = (_func_int **)&PTR__list_004f8ab8;
  plVar1 = (this->
           super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ).next;
  while (plVar2 = plVar1,
        plVar2 != &this->
                   super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        ) {
    plVar1 = plVar2->next;
    if (plVar2 != (list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                   *)0x0) {
      (*plVar2->_vptr_list_elem[1])();
    }
  }
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  )._vptr_list_elem = (_func_int **)&PTR__list_elem_004f8b20;
  plVar1 = (this->
           super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ).next;
  plVar2 = (this->
           super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ).prev;
  plVar1->prev = plVar2;
  plVar2->next = plVar1;
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ).next = &this->
            super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ;
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ).prev = &this->
            super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ;
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }